

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Option *pOVar1;
  initializer_list<Level> __l;
  Level level;
  App app;
  allocator_type local_2c6;
  less<Level> local_2c5;
  Level local_2c4;
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  string local_2a0;
  string local_280;
  string local_260;
  _Rb_tree<Level,_Level,_std::_Identity<Level>,_std::less<Level>,_std::allocator<Level>_> local_240;
  Level local_20c [3];
  App local_200;
  
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  CLI::App::App(&local_200,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"-l,--level","");
  local_20c[0] = High;
  local_20c[1] = Medium;
  local_20c[2] = 2;
  __l._M_len = 3;
  __l._M_array = local_20c;
  CLI::std::set<Level,_std::less<Level>,_std::allocator<Level>_>::set
            ((set<Level,_std::less<Level>,_std::allocator<Level>_> *)&local_240,__l,&local_2c5,
             &local_2c6);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Level settings","");
  pOVar1 = CLI::App::add_set<Level>
                     (&local_200,&local_280,&local_2c4,
                      (set<Level,_std::less<Level>,_std::allocator<Level>_> *)&local_240,&local_2a0)
  ;
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,"enum/Level in {High=0, Medium=1, Low=2}","");
  std::__cxx11::string::_M_assign((string *)&pOVar1->typeval_);
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  CLI::std::_Rb_tree<Level,_Level,_std::_Identity<Level>,_std::less<Level>,_std::allocator<Level>_>
  ::~_Rb_tree(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  CLI::App::parse(&local_200,argc,argv);
  CLI::App::~App(&local_200);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;

    Level level;
    app.add_set("-l,--level", level, {High, Medium, Low}, "Level settings")
        ->set_type_name("enum/Level in {High=0, Medium=1, Low=2}");

    CLI11_PARSE(app, argc, argv);

    return 0;
}